

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O2

int ARKodeSetAdjointCheckpointIndex(void *arkode_mem,suncountertype step_index)

{
  int line;
  int error_code;
  char *msgfmt;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
    line = 0x88e;
  }
  else {
    if (-1 < step_index) {
      *(suncountertype *)((long)arkode_mem + 0x430) = step_index;
      return 0;
    }
    msgfmt = "step_index must be >= 0";
    error_code = -0x16;
    line = 0x896;
  }
  arkProcessError((ARKodeMem)arkode_mem,error_code,line,"ARKodeSetAdjointCheckpointIndex",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_io.c"
                  ,msgfmt);
  return error_code;
}

Assistant:

int ARKodeSetAdjointCheckpointIndex(void* arkode_mem, suncountertype step_index)
{
  ARKodeMem ark_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  if (step_index < 0)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "step_index must be >= 0");
    return ARK_ILL_INPUT;
  }

  ark_mem->checkpoint_step_idx = step_index;

  return (ARK_SUCCESS);
}